

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_request_compatibility_mode(laszip_POINTER pointer,laszip_BOOL request)

{
  laszip_dll_struct *laszip_dll;
  laszip_BOOL request_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      *(bool *)((long)pointer + 0xa82) = request != 0;
      if (request != 0) {
        *(undefined1 *)((long)pointer + 0xa81) = 0;
      }
      *(undefined1 *)((long)pointer + 0x248) = 0;
      pointer_local._4_4_ = 0;
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,"writer is already open");
      pointer_local._4_4_ = 1;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,"reader is already open");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_request_compatibility_mode(
    laszip_POINTER                     pointer
    , const laszip_BOOL                request
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    laszip_dll->request_compatibility_mode = request;

    if (request) // only one should be on
    {
      laszip_dll->request_native_extension = FALSE;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_request_compatibility_mode");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}